

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathVariableLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  xmlXPathObjectPtr pxVar1;
  
  if (ctxt != (xmlXPathContextPtr)0x0) {
    if ((ctxt->varLookupFunc != (xmlXPathVariableLookupFunc)0x0) &&
       (pxVar1 = (*ctxt->varLookupFunc)(ctxt->varLookupData,name,ns_uri),
       pxVar1 != (xmlXPathObjectPtr)0x0)) {
      return pxVar1;
    }
    if (name != (xmlChar *)0x0 && ctxt->varHash != (xmlHashTablePtr)0x0) {
      pxVar1 = (xmlXPathObjectPtr)xmlHashLookup2(ctxt->varHash,name,ns_uri);
      pxVar1 = xmlXPathCacheObjectCopy(ctxt,pxVar1);
      return pxVar1;
    }
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

xmlXPathObjectPtr
xmlXPathVariableLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    if (ctxt == NULL)
	return(NULL);

    if (ctxt->varLookupFunc != NULL) {
	xmlXPathObjectPtr ret;

	ret = ((xmlXPathVariableLookupFunc)ctxt->varLookupFunc)
	        (ctxt->varLookupData, name, ns_uri);
	if (ret != NULL) return(ret);
    }

    if (ctxt->varHash == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    return(xmlXPathCacheObjectCopy(ctxt, (xmlXPathObjectPtr)
		xmlHashLookup2(ctxt->varHash, name, ns_uri)));
}